

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsImplications.cpp
# Opt level: O2

void __thiscall
HighsImplications::cleanupVlb
          (HighsImplications *this,HighsInt col,HighsInt vlbCol,VarBound *vlb,double lb,
          bool *redundant,bool *infeasible,bool allowBoundChanges)

{
  HighsMipSolverData *pHVar1;
  double dVar2;
  double dVar3;
  HighsDomainChange boundchg;
  HighsCDouble HVar4;
  HighsCDouble maxlb;
  HighsCDouble local_38;
  
  *redundant = false;
  *infeasible = false;
  if (vlbCol != -1) {
    dVar2 = VarBound::maxValue(vlb);
    local_38.lo = 0.0;
    local_38.hi = dVar2;
    dVar3 = VarBound::minValue(vlb);
    pHVar1 = (this->mipsolver->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    if (dVar2 <= pHVar1->feastol + lb) {
      *redundant = true;
    }
    else if (lb - pHVar1->epsilon <= dVar3) {
      if (allowBoundChanges && pHVar1->epsilon + lb < dVar3) {
        boundchg.boundval = dVar3 + 0.0;
        boundchg.column = col;
        boundchg.boundtype = kLower;
        HighsDomain::changeBound(&pHVar1->domain,boundchg,(Reason)0xfffffffe);
        *infeasible = (((this->mipsolver->mipdata_)._M_t.
                        super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                        .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->domain).
                      infeasible_;
      }
    }
    else {
      HVar4 = operator-(lb,&local_38);
      dVar2 = HVar4.lo + HVar4.hi;
      if (0.0 < vlb->coef || vlb->coef == 0.0) {
        vlb->constant = lb;
        dVar2 = -dVar2;
      }
      vlb->coef = dVar2;
    }
  }
  return;
}

Assistant:

void HighsImplications::cleanupVlb(HighsInt col, HighsInt vlbCol,
                                   HighsImplications::VarBound& vlb, double lb,
                                   bool& redundant, bool& infeasible,
                                   bool allowBoundChanges) const {
  // initialize
  redundant = false;
  infeasible = false;

  // return if there is no variable bound
  if (vlbCol == -1) return;

  // check variable lower bound
  mipsolver.mipdata_->debugSolution.checkVlb(col, vlbCol, vlb.coef,
                                             vlb.constant);

  HighsCDouble maxlb = vlb.maxValue();
  HighsCDouble minlb = vlb.minValue();

  if (maxlb <= lb + mipsolver.mipdata_->feastol) {
    // variable bound is redundant
    redundant = true;
  } else if (minlb < lb - mipsolver.mipdata_->epsilon) {
    // coefficient can be tightened
    double newcoef = static_cast<double>(lb - maxlb);
    if (vlb.coef < 0) {
      vlb.coef = newcoef;
    } else {
      vlb.constant = lb;
      vlb.coef = -newcoef;
    }
    // check tightened variable lower bound
    mipsolver.mipdata_->debugSolution.checkVlb(col, vlbCol, vlb.coef,
                                               vlb.constant);
  } else if (allowBoundChanges && minlb > lb + mipsolver.mipdata_->epsilon) {
    mipsolver.mipdata_->domain.changeBound(HighsBoundType::kLower, col,
                                           static_cast<double>(minlb),
                                           HighsDomain::Reason::unspecified());
    infeasible = mipsolver.mipdata_->domain.infeasible();
  }
}